

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterInfo.cpp
# Opt level: O0

string * __thiscall helics::FilterInfo::getDestinationEndpoints_abi_cxx11_(FilterInfo *this)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  EptInformation *trgt;
  const_iterator __end4;
  const_iterator __begin4;
  vector<helics::EptInformation,_std::allocator<helics::EptInformation>_> *__range4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffff98;
  char cVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  _Alloc_hider in_stack_ffffffffffffffb8;
  __normal_iterator<const_helics::EptInformation_*,_std::vector<helics::EptInformation,_std::allocator<helics::EptInformation>_>_>
  local_18;
  pointer *local_10;
  
  cVar4 = (char)((ulong)in_stack_ffffffffffffff98 >> 0x38);
  bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x69974f);
  if ((bVar1) &&
     (bVar1 = std::vector<helics::EptInformation,_std::allocator<helics::EptInformation>_>::empty
                        ((vector<helics::EptInformation,_std::allocator<helics::EptInformation>_> *)
                         in_RDI), !bVar1)) {
    sVar2 = std::vector<helics::EptInformation,_std::allocator<helics::EptInformation>_>::size
                      ((vector<helics::EptInformation,_std::allocator<helics::EptInformation>_> *)
                       &in_RDI[6]._M_string_length);
    if (sVar2 == 1) {
      std::vector<helics::EptInformation,_std::allocator<helics::EptInformation>_>::front
                ((vector<helics::EptInformation,_std::allocator<helics::EptInformation>_> *)
                 in_stack_ffffffffffffff90);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator=(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    }
    else {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back(in_RDI,cVar4);
      local_10 = (pointer *)&in_RDI[6]._M_string_length;
      local_18._M_current =
           (EptInformation *)
           std::vector<helics::EptInformation,_std::allocator<helics::EptInformation>_>::begin
                     ((vector<helics::EptInformation,_std::allocator<helics::EptInformation>_> *)
                      in_stack_ffffffffffffff88);
      std::vector<helics::EptInformation,_std::allocator<helics::EptInformation>_>::end
                ((vector<helics::EptInformation,_std::allocator<helics::EptInformation>_> *)
                 in_stack_ffffffffffffff88);
      while (bVar1 = __gnu_cxx::
                     operator==<const_helics::EptInformation_*,_std::vector<helics::EptInformation,_std::allocator<helics::EptInformation>_>_>
                               ((__normal_iterator<const_helics::EptInformation_*,_std::vector<helics::EptInformation,_std::allocator<helics::EptInformation>_>_>
                                 *)in_stack_ffffffffffffff90,
                                (__normal_iterator<const_helics::EptInformation_*,_std::vector<helics::EptInformation,_std::allocator<helics::EptInformation>_>_>
                                 *)in_stack_ffffffffffffff88), ((bVar1 ^ 0xffU) & 1) != 0) {
        __gnu_cxx::
        __normal_iterator<const_helics::EptInformation_*,_std::vector<helics::EptInformation,_std::allocator<helics::EptInformation>_>_>
        ::operator*(&local_18);
        in_stack_ffffffffffffff90 = in_RDI + 8;
        __str = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                &stack0xffffffffffffffb8;
        generateJsonQuotedString((string *)in_stack_ffffffffffffffb8._M_p);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (in_RDI,__str);
        cVar4 = (char)((ulong)__str >> 0x38);
        std::__cxx11::string::~string(in_stack_ffffffffffffff90);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        push_back(in_RDI,cVar4);
        __gnu_cxx::
        __normal_iterator<const_helics::EptInformation_*,_std::vector<helics::EptInformation,_std::allocator<helics::EptInformation>_>_>
        ::operator++(&local_18);
      }
      pvVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::back(in_stack_ffffffffffffff90);
      *pvVar3 = ']';
    }
  }
  return (string *)(in_RDI + 8);
}

Assistant:

const std::string& FilterInfo::getDestinationEndpoints() const
{
    if (destEpts.empty()) {
        if (!destEndpoints.empty()) {
            if (destEndpoints.size() == 1) {
                destEpts = destEndpoints.front().key;
            } else {
                destEpts.push_back('[');
                for (const auto& trgt : destEndpoints) {
                    destEpts.append(generateJsonQuotedString(trgt.key));
                    destEpts.push_back(',');
                }
                destEpts.back() = ']';
            }
        }
    }
    return destEpts;
}